

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O0

vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
* __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::derivatives_at(vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 *__return_storage_ptr__,
                CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
                *this,double t,Index order)

{
  allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *this_00;
  double dVar1;
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *pPVar2;
  element_type *peVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *pDVar4;
  CoeffReturnType pdVar5;
  element_type *peVar6;
  reference this_01;
  Matrix<double,_1,_3,_1,_1,_3> local_d8;
  size_type local_c0;
  Index i;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *local_b0;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *local_a8;
  undefined1 local_a0 [8];
  function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> c;
  undefined1 local_78 [8];
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  surface_derivatives;
  double v;
  double u;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  curve_derivatives;
  Index order_local;
  double t_local;
  CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  *this_local;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *derivatives;
  
  curve_derivatives.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)order;
  peVar3 = std::
           __shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_curve_geometry);
  (*(peVar3->super_CurveBase<2L>)._vptr_CurveBase[6])
            (t,(vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&u,peVar3,
             curve_derivatives.
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)
           std::
           vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                         *)&u,0);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[](pDVar4,0);
  dVar1 = *pdVar5;
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)
           std::
           vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                         *)&u,0);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[](pDVar4,1);
  surface_derivatives.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar5;
  peVar6 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_surface_geometry);
  (*(peVar6->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
            (dVar1,surface_derivatives.
                   super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78,peVar6,
             curve_derivatives.
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  c._M_invoker._7_1_ = 0;
  pPVar2 = &(curve_derivatives.
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
            super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>;
  this_00 = (allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)((long)&c._M_invoker + 6);
  std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::allocator(this_00);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector(__return_storage_ptr__,(size_type)((long)(pPVar2->m_storage).m_data.array + 1),this_00);
  std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::~allocator
            ((allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)((long)&c._M_invoker + 6));
  std::function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)>::function
            ((function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)local_a0);
  local_b0 = (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              *)&u;
  local_a8 = (vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)local_78;
  i = (Index)local_a0;
  std::function<Eigen::Matrix<double,1,3,1,1,3>(long,long,long)>::operator=
            ((function<Eigen::Matrix<double,1,3,1,1,3>(long,long,long)> *)local_a0,
             (anon_class_24_3_7c38b2f8 *)&i);
  for (local_c0 = 0;
      (long)local_c0 <=
      (long)curve_derivatives.
            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage; local_c0 = local_c0 + 1) {
    std::function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)>::operator()
              (&local_d8,
               (function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)local_a0,
               local_c0,0,0);
    this_01 = std::
              vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              ::operator[](__return_storage_ptr__,local_c0);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=(this_01,&local_d8);
  }
  c._M_invoker._7_1_ = 1;
  std::function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)>::~function
            ((function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)local_a0);
  if ((c._M_invoker._7_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
    ::~vector(__return_storage_ptr__);
  }
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             *)local_78);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::~vector((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             *)&u);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order)
        const override
    {
        // derivatives of base geometries

        const auto curve_derivatives =
            m_curve_geometry->derivatives_at(t, order);

        const double u = curve_derivatives[0][0];
        const double v = curve_derivatives[0][1];

        const auto surface_derivatives =
            m_surface_geometry->derivatives_at(u, v, order);

        // compute combined derivatives

        std::vector<Vector> derivatives(order + 1);

        std::function<Vector(Index, Index, Index)> c;

        c = [&](Index order, Index i, Index j) -> Vector {
            if (order > 0) {
                Vector result = Vector::Zero();

                for (Index a = 1; a <= order; a++) {
                    result += (
                        c(order - a, i + 1, j) * curve_derivatives[a][0] +
                        c(order - a, i, j + 1) * curve_derivatives[a][1]
                    ) * Math::binom(order - 1, a - 1);
                }

                return result;
            } else {
                const Index index = NurbsSurfaceShapeFunction::shape_index(i, j);
                return surface_derivatives[index];
            }
        };

        for (Index i = 0; i <= order; i++) {
            derivatives[i] = c(i, 0, 0);
        }

        return derivatives;
    }